

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O1

string * getLinuxFolderDefault_abi_cxx11_
                   (string *__return_storage_ptr__,char *envName,char *defaultRelativePath)

{
  char *__s;
  long *plVar1;
  runtime_error *this;
  long *plVar2;
  char buffer [200];
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118 [2];
  long local_108 [2];
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __s = getenv(envName);
  if (__s == (char *)0x0) {
    sago::internal::getHome_abi_cxx11_();
    plVar1 = (long *)std::__cxx11::string::append((char *)local_118);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_128 = *plVar2;
      lStack_120 = plVar1[3];
      local_138 = &local_128;
    }
    else {
      local_128 = *plVar2;
      local_138 = (long *)*plVar1;
    }
    local_130 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_138);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_e8 = *plVar2;
      lStack_e0 = plVar1[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *plVar2;
      local_f8 = (long *)*plVar1;
    }
    local_f0 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f8);
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    if (local_118[0] != local_108) {
      operator_delete(local_118[0],local_108[0] + 1);
    }
  }
  else {
    if (*__s != '/') {
      snprintf((char *)&local_f8,200,
               "Environment \"%s\" does not start with an \'/\'. XDG specifies that the value must be absolute. The current value is: \"%s\""
               ,envName,__s);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,(char *)&local_f8);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)__s);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getLinuxFolderDefault(const char* envName, const char* defaultRelativePath) {
	std::string res;
	const char* tempRes = std::getenv(envName);
	if (tempRes) {
		throwOnRelative(envName, tempRes);
		res = tempRes;
		return res;
	}
	res = sago::internal::getHome() + "/" + defaultRelativePath;
	return res;
}